

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader>_>_> * __thiscall
kj::_::ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader>_>_>::operator=
          (ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader>_>_> *this,
          ExceptionOr<kj::Maybe<kj::Own<capnp::MessageReader>_>_> *param_1)

{
  MessageReader *pMVar1;
  Disposer *pDVar2;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      pMVar1 = (this->value).ptr.field_1.value.ptr.ptr;
      if (pMVar1 != (MessageReader *)0x0) {
        (this->value).ptr.field_1.value.ptr.ptr = (MessageReader *)0x0;
        pDVar2 = (this->value).ptr.field_1.value.ptr.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(code *)((long)pMVar1->arenaSpace +
                                  (long)(pMVar1->_vptr_MessageReader[-2] + -0x18)));
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      (this->value).ptr.field_1.value.ptr.disposer = (param_1->value).ptr.field_1.value.ptr.disposer
      ;
      (this->value).ptr.field_1.value.ptr.ptr = (param_1->value).ptr.field_1.value.ptr.ptr;
      (param_1->value).ptr.field_1.value.ptr.ptr = (MessageReader *)0x0;
      (this->value).ptr.isSet = true;
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;